

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall Matrix<double,_-1,_-1>::Identity(Matrix<double,__1,__1> *this)

{
  int iVar1;
  int iVar2;
  ostream *this_00;
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix<double,__1,__1> *this_local;
  
  iVar1 = row(this);
  iVar2 = col(this);
  if (iVar1 == iVar2) {
    local_24 = 0;
    while( true ) {
      iVar1 = row(this);
      if (iVar1 <= local_24) break;
      local_28 = 0;
      while( true ) {
        iVar1 = col(this);
        if (iVar1 <= local_28) break;
        if (local_24 == local_28) {
          SetElement(this,local_24,local_28,1.0);
        }
        else {
          SetElement(this,local_24,local_28,0.0);
        }
        local_28 = local_28 + 1;
      }
      local_24 = local_24 + 1;
    }
    _this_local = *this;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "identity matrix can only be initialized by square matrix");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    _this_local = Zero(this);
  }
  return _this_local;
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::Identity()
{
    // 这样的实现方法会导致过多占用内存
    // 故不使用静态成员的方法实现
    // 2020 09 10
    // Matrix<Type, _0, _1> Identity;

    // 2020 09 11 
    // 恢复使用静态方法  问题已解决

    if(this->row() != this->col())
    {
        cerr << "identity matrix can only be initialized by square matrix" << endl;
        return this->Zero();
    }
    for (int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
            if(i == j)
                this->SetElement(i, j, 1);
            else
                this->SetElement(i, j, 0);
    return (*this);
}